

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O1

void __thiscall Fad<double>::Fad(Fad<double> *this,int sz,int i,double *x)

{
  double local_20;
  
  this->val_ = *x;
  local_20 = 0.0;
  Vector<double>::Vector(&this->dx_,sz,&local_20);
  this->defaultVal = 0.0;
  (this->dx_).ptr_to_data[i] = 1.0;
  return;
}

Assistant:

Fad(const int sz, const int i, const T & x) : val_(x), dx_(sz,T(0)), defaultVal(T(0))
    {dx_[i]=1.;}